

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_impl.h
# Opt level: O0

uint32_t load32(uint8_t *src)

{
  uint32_t w;
  int ossl_is_little_endian;
  uint8_t *src_local;
  
  return *(uint32_t *)src;
}

Assistant:

static ossl_inline uint32_t load32(const uint8_t *src)
{
    DECLARE_IS_ENDIAN;

    if (IS_LITTLE_ENDIAN) {
        uint32_t w;
        memcpy(&w, src, sizeof(w));
        return w;
    } else {
        uint32_t w = ((uint32_t)src[0])
                   | ((uint32_t)src[1] <<  8)
                   | ((uint32_t)src[2] << 16)
                   | ((uint32_t)src[3] << 24);
        return w;
    }
}